

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMiMBIntersectorKMoeller<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Scene *pSVar9;
  Ref<embree::Geometry> *pRVar10;
  Geometry *pGVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 (*pauVar34) [16];
  uint uVar35;
  AABBNodeMB4D *node1;
  ulong uVar36;
  long lVar37;
  long lVar38;
  uint uVar39;
  int iVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  undefined1 (*pauVar53) [16];
  vint4 bi_1;
  undefined1 auVar54 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar55 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  vint4 bi;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  vint4 ai;
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  float fVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [64];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  uint uVar96;
  uint uVar97;
  undefined1 auVar95 [64];
  undefined1 auVar98 [32];
  undefined1 auVar99 [64];
  undefined1 auVar100 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [64];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined4 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [16];
  undefined1 auVar114 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_14b0 [16];
  undefined1 (*local_1498) [16];
  ulong local_1490;
  ulong local_1488;
  long local_1480;
  ulong local_1478;
  ulong local_1470;
  long local_1468;
  ulong local_1460;
  ulong local_1458;
  ulong local_1450;
  ulong local_1448;
  ulong local_1440;
  ulong local_1438;
  RTCFilterFunctionNArguments local_1430;
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [16];
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  undefined1 local_12c0 [16];
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  RTCHitN local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined4 local_1230;
  undefined4 uStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  undefined1 local_1220 [16];
  uint local_1210;
  uint uStack_120c;
  uint uStack_1208;
  uint uStack_1204;
  uint local_1200;
  uint uStack_11fc;
  uint uStack_11f8;
  uint uStack_11f4;
  uint uStack_11f0;
  uint uStack_11ec;
  uint uStack_11e8;
  uint uStack_11e4;
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [32];
  undefined1 local_1160 [32];
  undefined1 local_1140 [32];
  undefined1 local_1120 [32];
  undefined1 local_1100 [32];
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  
  pauVar53 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_1340._4_4_ = fVar1;
  local_1340._0_4_ = fVar1;
  local_1340._8_4_ = fVar1;
  local_1340._12_4_ = fVar1;
  auVar85 = ZEXT1664(local_1340);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_1350._4_4_ = fVar2;
  local_1350._0_4_ = fVar2;
  local_1350._8_4_ = fVar2;
  local_1350._12_4_ = fVar2;
  auVar89 = ZEXT1664(local_1350);
  fVar86 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_1360._4_4_ = fVar86;
  local_1360._0_4_ = fVar86;
  local_1360._8_4_ = fVar86;
  local_1360._12_4_ = fVar86;
  auVar95 = ZEXT1664(local_1360);
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar86 = fVar86 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar48 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar49 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar44 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar51 = uVar48 ^ 0x10;
  uVar50 = uVar49 ^ 0x10;
  iVar40 = (tray->tfar).field_0.i[k];
  auVar61 = ZEXT1664(CONCAT412(iVar40,CONCAT48(iVar40,CONCAT44(iVar40,iVar40))));
  local_1370._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  local_1370._8_4_ = -fVar1;
  local_1370._12_4_ = -fVar1;
  auVar99 = ZEXT1664(local_1370);
  local_1380._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  local_1380._8_4_ = -fVar2;
  local_1380._12_4_ = -fVar2;
  auVar102 = ZEXT1664(local_1380);
  local_1390._0_8_ = CONCAT44(fVar86,fVar86) ^ 0x8000000080000000;
  local_1390._8_4_ = -fVar86;
  local_1390._12_4_ = -fVar86;
  auVar106 = ZEXT1664(local_1390);
  iVar40 = (tray->tnear).field_0.i[k];
  local_13a0._4_4_ = iVar40;
  local_13a0._0_4_ = iVar40;
  local_13a0._8_4_ = iVar40;
  local_13a0._12_4_ = iVar40;
  auVar110 = ZEXT1664(local_13a0);
  local_fe0._16_16_ = mm_lookupmask_ps._240_16_;
  local_fe0._0_16_ = mm_lookupmask_ps._0_16_;
  local_1498 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  auVar58._8_4_ = 0x3f800000;
  auVar58._0_8_ = 0x3f8000003f800000;
  auVar58._12_4_ = 0x3f800000;
  auVar58._16_4_ = 0x3f800000;
  auVar58._20_4_ = 0x3f800000;
  auVar58._24_4_ = 0x3f800000;
  auVar58._28_4_ = 0x3f800000;
  auVar84._8_4_ = 0xbf800000;
  auVar84._0_8_ = 0xbf800000bf800000;
  auVar84._12_4_ = 0xbf800000;
  auVar84._16_4_ = 0xbf800000;
  auVar84._20_4_ = 0xbf800000;
  auVar84._24_4_ = 0xbf800000;
  auVar84._28_4_ = 0xbf800000;
  local_1000 = vblendvps_avx(auVar58,auVar84,local_fe0);
  local_1490 = uVar49;
  local_1488 = uVar48;
LAB_01592e8b:
  do {
    do {
      if (pauVar53 == (undefined1 (*) [16])&local_fa0) {
        return;
      }
      pauVar34 = pauVar53 + -1;
      pauVar53 = pauVar53 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar34 + 8));
    uVar52 = *(ulong *)*pauVar53;
    while ((uVar52 & 8) == 0) {
      uVar36 = uVar52 & 0xfffffffffffffff0;
      uVar107 = *(undefined4 *)(ray + k * 4 + 0x70);
      auVar62._4_4_ = uVar107;
      auVar62._0_4_ = uVar107;
      auVar62._8_4_ = uVar107;
      auVar62._12_4_ = uVar107;
      auVar64 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar48),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar48));
      auVar64 = vfmadd213ps_fma(auVar64,auVar85._0_16_,auVar99._0_16_);
      auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar49),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar49));
      auVar63 = vfmadd213ps_fma(auVar63,auVar89._0_16_,auVar102._0_16_);
      auVar64 = vpmaxsd_avx(auVar64,auVar63);
      auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar44),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar44));
      auVar63 = vfmadd213ps_fma(auVar63,auVar95._0_16_,auVar106._0_16_);
      auVar63 = vpmaxsd_avx(auVar63,auVar110._0_16_);
      auVar64 = vpmaxsd_avx(auVar64,auVar63);
      auVar63 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar51),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar51));
      auVar63 = vfmadd213ps_fma(auVar63,auVar85._0_16_,auVar99._0_16_);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + uVar50),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + uVar50));
      auVar70 = vfmadd213ps_fma(auVar70,auVar89._0_16_,auVar102._0_16_);
      auVar63 = vpminsd_avx(auVar63,auVar70);
      auVar70 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar36 + 0x80 + (uVar44 ^ 0x10)),auVar62,
                                *(undefined1 (*) [16])(uVar36 + 0x20 + (uVar44 ^ 0x10)));
      auVar70 = vfmadd213ps_fma(auVar70,auVar95._0_16_,auVar106._0_16_);
      auVar70 = vpminsd_avx(auVar70,auVar61._0_16_);
      auVar63 = vpminsd_avx(auVar63,auVar70);
      if (((uint)uVar52 & 7) == 6) {
        auVar70 = vcmpps_avx(auVar64,auVar63,2);
        auVar63 = vcmpps_avx(*(undefined1 (*) [16])(uVar36 + 0xe0),auVar62,2);
        auVar62 = vcmpps_avx(auVar62,*(undefined1 (*) [16])(uVar36 + 0xf0),1);
        auVar63 = vandps_avx(auVar63,auVar62);
        auVar63 = vandps_avx(auVar63,auVar70);
      }
      else {
        auVar63 = vcmpps_avx(auVar64,auVar63,2);
      }
      auVar63 = vpslld_avx(auVar63,0x1f);
      uVar39 = vmovmskps_avx(auVar63);
      local_11e0._0_16_ = auVar64;
      if (uVar39 == 0) goto LAB_01592e8b;
      uVar39 = uVar39 & 0xff;
      lVar38 = 0;
      for (uVar52 = (ulong)uVar39; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
        lVar38 = lVar38 + 1;
      }
      uVar52 = *(ulong *)(uVar36 + lVar38 * 8);
      uVar39 = uVar39 - 1 & uVar39;
      uVar41 = (ulong)uVar39;
      if (uVar39 != 0) {
        uVar35 = *(uint *)(local_11e0 + lVar38 * 4);
        lVar38 = 0;
        for (; (uVar41 & 1) == 0; uVar41 = uVar41 >> 1 | 0x8000000000000000) {
          lVar38 = lVar38 + 1;
        }
        uVar39 = uVar39 - 1 & uVar39;
        uVar43 = (ulong)uVar39;
        uVar41 = *(ulong *)(uVar36 + lVar38 * 8);
        uVar96 = *(uint *)(local_11e0 + lVar38 * 4);
        if (uVar39 == 0) {
          if (uVar35 < uVar96) {
            *(ulong *)*pauVar53 = uVar41;
            *(uint *)(*pauVar53 + 8) = uVar96;
            pauVar53 = pauVar53 + 1;
          }
          else {
            *(ulong *)*pauVar53 = uVar52;
            *(uint *)(*pauVar53 + 8) = uVar35;
            uVar52 = uVar41;
            pauVar53 = pauVar53 + 1;
          }
        }
        else {
          auVar64._8_8_ = 0;
          auVar64._0_8_ = uVar52;
          auVar64 = vpunpcklqdq_avx(auVar64,ZEXT416(uVar35));
          auVar63._8_8_ = 0;
          auVar63._0_8_ = uVar41;
          auVar63 = vpunpcklqdq_avx(auVar63,ZEXT416(uVar96));
          lVar38 = 0;
          for (; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
            lVar38 = lVar38 + 1;
          }
          uVar39 = uVar39 - 1 & uVar39;
          uVar52 = (ulong)uVar39;
          auVar70._8_8_ = 0;
          auVar70._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
          auVar62 = vpunpcklqdq_avx(auVar70,ZEXT416(*(uint *)(local_11e0 + lVar38 * 4)));
          auVar70 = vpcmpgtd_avx(auVar63,auVar64);
          if (uVar39 == 0) {
            auVar77 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar63,auVar64,auVar77);
            auVar64 = vblendvps_avx(auVar64,auVar63,auVar77);
            auVar63 = vpcmpgtd_avx(auVar62,auVar70);
            auVar77 = vpshufd_avx(auVar63,0xaa);
            auVar63 = vblendvps_avx(auVar62,auVar70,auVar77);
            auVar70 = vblendvps_avx(auVar70,auVar62,auVar77);
            auVar62 = vpcmpgtd_avx(auVar70,auVar64);
            auVar77 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar70,auVar64,auVar77);
            auVar64 = vblendvps_avx(auVar64,auVar70,auVar77);
            *pauVar53 = auVar64;
            pauVar53[1] = auVar62;
            uVar52 = auVar63._0_8_;
            pauVar53 = pauVar53 + 2;
          }
          else {
            lVar38 = 0;
            for (; (uVar52 & 1) == 0; uVar52 = uVar52 >> 1 | 0x8000000000000000) {
              lVar38 = lVar38 + 1;
            }
            auVar77._8_8_ = 0;
            auVar77._0_8_ = *(ulong *)(uVar36 + lVar38 * 8);
            auVar54 = vpunpcklqdq_avx(auVar77,ZEXT416(*(uint *)(local_11e0 + lVar38 * 4)));
            auVar77 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar63,auVar64,auVar77);
            auVar64 = vblendvps_avx(auVar64,auVar63,auVar77);
            auVar63 = vpcmpgtd_avx(auVar54,auVar62);
            auVar77 = vpshufd_avx(auVar63,0xaa);
            auVar63 = vblendvps_avx(auVar54,auVar62,auVar77);
            auVar62 = vblendvps_avx(auVar62,auVar54,auVar77);
            auVar77 = vpcmpgtd_avx(auVar62,auVar64);
            auVar54 = vpshufd_avx(auVar77,0xaa);
            auVar77 = vblendvps_avx(auVar62,auVar64,auVar54);
            auVar64 = vblendvps_avx(auVar64,auVar62,auVar54);
            auVar62 = vpcmpgtd_avx(auVar63,auVar70);
            auVar54 = vpshufd_avx(auVar62,0xaa);
            auVar62 = vblendvps_avx(auVar63,auVar70,auVar54);
            auVar63 = vblendvps_avx(auVar70,auVar63,auVar54);
            auVar70 = vpcmpgtd_avx(auVar77,auVar63);
            auVar54 = vpshufd_avx(auVar70,0xaa);
            auVar70 = vblendvps_avx(auVar77,auVar63,auVar54);
            auVar63 = vblendvps_avx(auVar63,auVar77,auVar54);
            *pauVar53 = auVar64;
            pauVar53[1] = auVar63;
            pauVar53[2] = auVar70;
            uVar52 = auVar62._0_8_;
            pauVar53 = pauVar53 + 3;
          }
        }
      }
    }
    local_1480 = (ulong)((uint)uVar52 & 0xf) - 8;
    uVar52 = uVar52 & 0xfffffffffffffff0;
    for (lVar38 = 0; lVar38 != local_1480; lVar38 = lVar38 + 1) {
      lVar37 = lVar38 * 0x60;
      pSVar9 = context->scene;
      pRVar10 = (pSVar9->geometries).items;
      pGVar11 = pRVar10[*(uint *)(uVar52 + 0x40 + lVar37)].ptr;
      fVar1 = (pGVar11->time_range).lower;
      fVar1 = pGVar11->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar1) / ((pGVar11->time_range).upper - fVar1));
      auVar64 = vroundss_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),9);
      auVar64 = vminss_avx(auVar64,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
      auVar16 = vmaxss_avx(ZEXT816(0) << 0x20,auVar64);
      iVar40 = (int)auVar16._0_4_;
      lVar46 = (long)iVar40 * 0x38;
      lVar12 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar46);
      local_1450 = (ulong)*(uint *)(uVar52 + 4 + lVar37);
      auVar64 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar52 + lVar37) * 4);
      uVar49 = (ulong)*(uint *)(uVar52 + 0x10 + lVar37);
      auVar63 = *(undefined1 (*) [16])(lVar12 + uVar49 * 4);
      uVar36 = (ulong)*(uint *)(uVar52 + 0x20 + lVar37);
      auVar70 = *(undefined1 (*) [16])(lVar12 + uVar36 * 4);
      uVar41 = (ulong)*(uint *)(uVar52 + 0x30 + lVar37);
      auVar62 = *(undefined1 (*) [16])(lVar12 + uVar41 * 4);
      local_1468 = *(long *)&pRVar10[*(uint *)(uVar52 + 0x44 + lVar37)].ptr[2].numPrimitives;
      lVar12 = *(long *)(local_1468 + lVar46);
      auVar77 = *(undefined1 (*) [16])(lVar12 + local_1450 * 4);
      local_1440 = (ulong)*(uint *)(uVar52 + 0x14 + lVar37);
      auVar54 = *(undefined1 (*) [16])(lVar12 + local_1440 * 4);
      local_1438 = (ulong)*(uint *)(uVar52 + 0x24 + lVar37);
      auVar55 = *(undefined1 (*) [16])(lVar12 + local_1438 * 4);
      uVar43 = (ulong)*(uint *)(uVar52 + 0x34 + lVar37);
      auVar4 = *(undefined1 (*) [16])(lVar12 + uVar43 * 4);
      lVar12 = *(long *)&pRVar10[*(uint *)(uVar52 + 0x48 + lVar37)].ptr[2].numPrimitives;
      lVar13 = *(long *)(lVar12 + lVar46);
      uVar45 = (ulong)*(uint *)(uVar52 + 8 + lVar37);
      auVar5 = *(undefined1 (*) [16])(lVar13 + uVar45 * 4);
      local_1460 = (ulong)*(uint *)(uVar52 + 0x18 + lVar37);
      auVar6 = *(undefined1 (*) [16])(lVar13 + local_1460 * 4);
      local_1458 = (ulong)*(uint *)(uVar52 + 0x28 + lVar37);
      auVar7 = *(undefined1 (*) [16])(lVar13 + local_1458 * 4);
      local_1448 = (ulong)*(uint *)(uVar52 + 0x38 + lVar37);
      auVar8 = *(undefined1 (*) [16])(lVar13 + local_1448 * 4);
      fVar1 = fVar1 - auVar16._0_4_;
      lVar13 = *(long *)&pRVar10[*(uint *)(uVar52 + 0x4c + lVar37)].ptr[2].numPrimitives;
      lVar46 = *(long *)(lVar13 + lVar46);
      uVar48 = (ulong)*(uint *)(uVar52 + 0xc + lVar37);
      auVar16 = *(undefined1 (*) [16])(lVar46 + uVar48 * 4);
      local_1478 = (ulong)*(uint *)(uVar52 + 0x1c + lVar37);
      auVar67 = *(undefined1 (*) [16])(lVar46 + local_1478 * 4);
      auVar78 = vunpcklps_avx(auVar64,auVar5);
      auVar5 = vunpckhps_avx(auVar64,auVar5);
      auVar87 = vunpcklps_avx(auVar77,auVar16);
      auVar77 = vunpckhps_avx(auVar77,auVar16);
      uVar47 = (ulong)*(uint *)(uVar52 + 0x2c + lVar37);
      auVar64 = *(undefined1 (*) [16])(lVar46 + uVar47 * 4);
      local_12c0 = vunpcklps_avx(auVar5,auVar77);
      local_1300 = vunpcklps_avx(auVar78,auVar87);
      local_12e0 = vunpckhps_avx(auVar78,auVar87);
      auVar5 = vunpcklps_avx(auVar63,auVar6);
      auVar77 = vunpckhps_avx(auVar63,auVar6);
      auVar6 = vunpcklps_avx(auVar54,auVar67);
      auVar54 = vunpckhps_avx(auVar54,auVar67);
      local_1470 = (ulong)*(uint *)(uVar52 + 0x3c + lVar37);
      auVar63 = *(undefined1 (*) [16])(lVar46 + local_1470 * 4);
      local_12b0 = vunpcklps_avx(auVar77,auVar54);
      local_12f0 = vunpcklps_avx(auVar5,auVar6);
      local_12d0 = vunpckhps_avx(auVar5,auVar6);
      auVar54 = vunpcklps_avx(auVar70,auVar7);
      auVar70 = vunpckhps_avx(auVar70,auVar7);
      auVar5 = vunpcklps_avx(auVar55,auVar64);
      auVar77 = vunpckhps_avx(auVar55,auVar64);
      lVar42 = (long)(iVar40 + 1) * 0x38;
      lVar46 = *(long *)(*(long *)&pGVar11[2].numPrimitives + lVar42);
      auVar64 = *(undefined1 (*) [16])(lVar46 + (ulong)*(uint *)(uVar52 + lVar37) * 4);
      auVar55 = vunpcklps_avx(auVar70,auVar77);
      local_1320 = vunpcklps_avx(auVar54,auVar5);
      local_1310 = vunpckhps_avx(auVar54,auVar5);
      auVar77 = vunpcklps_avx(auVar62,auVar8);
      auVar70 = vunpckhps_avx(auVar62,auVar8);
      auVar54 = vunpcklps_avx(auVar4,auVar63);
      auVar62 = vunpckhps_avx(auVar4,auVar63);
      lVar12 = *(long *)(lVar12 + lVar42);
      auVar63 = *(undefined1 (*) [16])(lVar12 + uVar45 * 4);
      auVar4 = vunpcklps_avx(auVar70,auVar62);
      auVar5 = vunpcklps_avx(auVar77,auVar54);
      local_1330 = vunpckhps_avx(auVar77,auVar54);
      lVar14 = *(long *)(local_1468 + lVar42);
      auVar62 = vunpcklps_avx(auVar64,auVar63);
      auVar70 = vunpckhps_avx(auVar64,auVar63);
      auVar64 = *(undefined1 (*) [16])(lVar14 + local_1450 * 4);
      lVar13 = *(long *)(lVar13 + lVar42);
      auVar63 = *(undefined1 (*) [16])(lVar13 + uVar48 * 4);
      auVar77 = vunpcklps_avx(auVar64,auVar63);
      auVar64 = vunpckhps_avx(auVar64,auVar63);
      auVar6 = vunpcklps_avx(auVar70,auVar64);
      auVar7 = vunpcklps_avx(auVar62,auVar77);
      auVar70 = vunpckhps_avx(auVar62,auVar77);
      auVar64 = *(undefined1 (*) [16])(lVar46 + uVar49 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar12 + local_1460 * 4);
      auVar77 = vunpcklps_avx(auVar64,auVar63);
      auVar62 = vunpckhps_avx(auVar64,auVar63);
      auVar64 = *(undefined1 (*) [16])(lVar14 + local_1440 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar13 + local_1478 * 4);
      auVar54 = vunpcklps_avx(auVar64,auVar63);
      auVar64 = vunpckhps_avx(auVar64,auVar63);
      auVar8 = vunpcklps_avx(auVar62,auVar64);
      auVar16 = vunpcklps_avx(auVar77,auVar54);
      auVar62 = vunpckhps_avx(auVar77,auVar54);
      auVar64 = *(undefined1 (*) [16])(lVar46 + uVar36 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar12 + local_1458 * 4);
      auVar54 = vunpcklps_avx(auVar64,auVar63);
      auVar77 = vunpckhps_avx(auVar64,auVar63);
      auVar64 = *(undefined1 (*) [16])(lVar14 + local_1438 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar13 + uVar47 * 4);
      auVar67 = vunpcklps_avx(auVar64,auVar63);
      auVar64 = vunpckhps_avx(auVar64,auVar63);
      auVar78 = vunpcklps_avx(auVar77,auVar64);
      auVar87 = vunpcklps_avx(auVar54,auVar67);
      auVar77 = vunpckhps_avx(auVar54,auVar67);
      auVar64 = *(undefined1 (*) [16])(lVar46 + uVar41 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar12 + local_1448 * 4);
      auVar67 = vunpcklps_avx(auVar64,auVar63);
      auVar54 = vunpckhps_avx(auVar64,auVar63);
      auVar64 = *(undefined1 (*) [16])(lVar14 + uVar43 * 4);
      auVar63 = *(undefined1 (*) [16])(lVar13 + local_1470 * 4);
      auVar65 = vunpcklps_avx(auVar64,auVar63);
      auVar64 = vunpckhps_avx(auVar64,auVar63);
      auVar63 = vunpcklps_avx(auVar54,auVar64);
      auVar54 = vunpcklps_avx(auVar67,auVar65);
      auVar64 = vunpckhps_avx(auVar67,auVar65);
      fVar2 = 1.0 - fVar1;
      auVar65._4_4_ = fVar2;
      auVar65._0_4_ = fVar2;
      auVar65._8_4_ = fVar2;
      auVar65._12_4_ = fVar2;
      auVar71._0_4_ = fVar1 * auVar7._0_4_;
      auVar71._4_4_ = fVar1 * auVar7._4_4_;
      auVar71._8_4_ = fVar1 * auVar7._8_4_;
      auVar71._12_4_ = fVar1 * auVar7._12_4_;
      auVar7 = vfmadd231ps_fma(auVar71,auVar65,local_1300);
      auVar79._0_4_ = fVar1 * auVar70._0_4_;
      auVar79._4_4_ = fVar1 * auVar70._4_4_;
      auVar79._8_4_ = fVar1 * auVar70._8_4_;
      auVar79._12_4_ = fVar1 * auVar70._12_4_;
      auVar70 = vfmadd231ps_fma(auVar79,auVar65,local_12e0);
      auVar73._0_4_ = auVar6._0_4_ * fVar1;
      auVar73._4_4_ = auVar6._4_4_ * fVar1;
      auVar73._8_4_ = auVar6._8_4_ * fVar1;
      auVar73._12_4_ = auVar6._12_4_ * fVar1;
      auVar6 = vfmadd231ps_fma(auVar73,auVar65,local_12c0);
      auVar67._0_4_ = fVar1 * auVar16._0_4_;
      auVar67._4_4_ = fVar1 * auVar16._4_4_;
      auVar67._8_4_ = fVar1 * auVar16._8_4_;
      auVar67._12_4_ = fVar1 * auVar16._12_4_;
      auVar16 = vfmadd231ps_fma(auVar67,auVar65,local_12f0);
      auVar81._0_4_ = fVar1 * auVar62._0_4_;
      auVar81._4_4_ = fVar1 * auVar62._4_4_;
      auVar81._8_4_ = fVar1 * auVar62._8_4_;
      auVar81._12_4_ = fVar1 * auVar62._12_4_;
      auVar62 = vfmadd231ps_fma(auVar81,auVar65,local_12d0);
      auVar108._0_4_ = auVar8._0_4_ * fVar1;
      auVar108._4_4_ = auVar8._4_4_ * fVar1;
      auVar108._8_4_ = auVar8._8_4_ * fVar1;
      auVar108._12_4_ = auVar8._12_4_ * fVar1;
      auVar8 = vfmadd231ps_fma(auVar108,auVar65,local_12b0);
      auVar93._0_4_ = auVar87._0_4_ * fVar1;
      auVar93._4_4_ = auVar87._4_4_ * fVar1;
      auVar93._8_4_ = auVar87._8_4_ * fVar1;
      auVar93._12_4_ = auVar87._12_4_ * fVar1;
      auVar67 = vfmadd231ps_fma(auVar93,auVar65,local_1320);
      auVar100._0_4_ = auVar77._0_4_ * fVar1;
      auVar100._4_4_ = auVar77._4_4_ * fVar1;
      auVar100._8_4_ = auVar77._8_4_ * fVar1;
      auVar100._12_4_ = auVar77._12_4_ * fVar1;
      auVar77 = vfmadd231ps_fma(auVar100,auVar65,local_1310);
      auVar113._0_4_ = auVar78._0_4_ * fVar1;
      auVar113._4_4_ = auVar78._4_4_ * fVar1;
      auVar113._8_4_ = auVar78._8_4_ * fVar1;
      auVar113._12_4_ = auVar78._12_4_ * fVar1;
      auVar55 = vfmadd231ps_fma(auVar113,auVar65,auVar55);
      auVar78._0_4_ = fVar1 * auVar54._0_4_;
      auVar78._4_4_ = fVar1 * auVar54._4_4_;
      auVar78._8_4_ = fVar1 * auVar54._8_4_;
      auVar78._12_4_ = fVar1 * auVar54._12_4_;
      auVar87._0_4_ = auVar64._0_4_ * fVar1;
      auVar87._4_4_ = auVar64._4_4_ * fVar1;
      auVar87._8_4_ = auVar64._8_4_ * fVar1;
      auVar87._12_4_ = auVar64._12_4_ * fVar1;
      auVar54._0_4_ = auVar63._0_4_ * fVar1;
      auVar54._4_4_ = auVar63._4_4_ * fVar1;
      auVar54._8_4_ = auVar63._8_4_ * fVar1;
      auVar54._12_4_ = auVar63._12_4_ * fVar1;
      auVar64 = vfmadd231ps_fma(auVar78,auVar65,auVar5);
      auVar63 = vfmadd231ps_fma(auVar87,auVar65,local_1330);
      lVar12 = uVar52 + 0x40 + lVar37;
      local_fc0 = *(undefined8 *)(lVar12 + 0x10);
      uStack_fb8 = *(undefined8 *)(lVar12 + 0x18);
      uStack_fb0 = local_fc0;
      uStack_fa8 = uStack_fb8;
      lVar37 = uVar52 + 0x50 + lVar37;
      local_12a0 = *(undefined8 *)(lVar37 + 0x10);
      uStack_1298 = *(undefined8 *)(lVar37 + 0x18);
      auVar54 = vfmadd231ps_fma(auVar54,auVar65,auVar4);
      uStack_1290 = local_12a0;
      uStack_1288 = uStack_1298;
      auVar103._16_16_ = auVar67;
      auVar103._0_16_ = auVar7;
      auVar111._16_16_ = auVar77;
      auVar111._0_16_ = auVar70;
      auVar114._16_16_ = auVar55;
      auVar114._0_16_ = auVar6;
      auVar66._16_16_ = auVar16;
      auVar66._0_16_ = auVar16;
      auVar68._16_16_ = auVar62;
      auVar68._0_16_ = auVar62;
      auVar72._16_16_ = auVar8;
      auVar72._0_16_ = auVar8;
      auVar74._16_16_ = auVar64;
      auVar74._0_16_ = auVar64;
      auVar82._16_16_ = auVar63;
      auVar82._0_16_ = auVar63;
      auVar56._16_16_ = auVar54;
      auVar56._0_16_ = auVar54;
      auVar58 = vsubps_avx(auVar103,auVar66);
      auVar84 = vsubps_avx(auVar111,auVar68);
      auVar22 = vsubps_avx(auVar114,auVar72);
      auVar66 = vsubps_avx(auVar74,auVar103);
      auVar23 = vsubps_avx(auVar82,auVar111);
      auVar24 = vsubps_avx(auVar56,auVar114);
      auVar25._4_4_ = auVar84._4_4_ * auVar24._4_4_;
      auVar25._0_4_ = auVar84._0_4_ * auVar24._0_4_;
      auVar25._8_4_ = auVar84._8_4_ * auVar24._8_4_;
      auVar25._12_4_ = auVar84._12_4_ * auVar24._12_4_;
      auVar25._16_4_ = auVar84._16_4_ * auVar24._16_4_;
      auVar25._20_4_ = auVar84._20_4_ * auVar24._20_4_;
      auVar25._24_4_ = auVar84._24_4_ * auVar24._24_4_;
      auVar25._28_4_ = auVar54._12_4_;
      auVar62 = vfmsub231ps_fma(auVar25,auVar23,auVar22);
      auVar26._4_4_ = auVar22._4_4_ * auVar66._4_4_;
      auVar26._0_4_ = auVar22._0_4_ * auVar66._0_4_;
      auVar26._8_4_ = auVar22._8_4_ * auVar66._8_4_;
      auVar26._12_4_ = auVar22._12_4_ * auVar66._12_4_;
      auVar26._16_4_ = auVar22._16_4_ * auVar66._16_4_;
      auVar26._20_4_ = auVar22._20_4_ * auVar66._20_4_;
      auVar26._24_4_ = auVar22._24_4_ * auVar66._24_4_;
      auVar26._28_4_ = auVar16._12_4_;
      auVar54 = vfmsub231ps_fma(auVar26,auVar24,auVar58);
      uVar107 = *(undefined4 *)(ray + k * 4);
      auVar69._4_4_ = uVar107;
      auVar69._0_4_ = uVar107;
      auVar69._8_4_ = uVar107;
      auVar69._12_4_ = uVar107;
      auVar69._16_4_ = uVar107;
      auVar69._20_4_ = uVar107;
      auVar69._24_4_ = uVar107;
      auVar69._28_4_ = uVar107;
      uVar107 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar75._4_4_ = uVar107;
      auVar75._0_4_ = uVar107;
      auVar75._8_4_ = uVar107;
      auVar75._12_4_ = uVar107;
      auVar75._16_4_ = uVar107;
      auVar75._20_4_ = uVar107;
      auVar75._24_4_ = uVar107;
      auVar75._28_4_ = uVar107;
      uVar107 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar83._4_4_ = uVar107;
      auVar83._0_4_ = uVar107;
      auVar83._8_4_ = uVar107;
      auVar83._12_4_ = uVar107;
      auVar83._16_4_ = uVar107;
      auVar83._20_4_ = uVar107;
      auVar83._24_4_ = uVar107;
      auVar83._28_4_ = uVar107;
      fVar1 = *(float *)(ray + k * 4 + 0x40);
      auVar98._4_4_ = fVar1;
      auVar98._0_4_ = fVar1;
      auVar98._8_4_ = fVar1;
      auVar98._12_4_ = fVar1;
      auVar98._16_4_ = fVar1;
      auVar98._20_4_ = fVar1;
      auVar98._24_4_ = fVar1;
      auVar98._28_4_ = fVar1;
      auVar25 = vsubps_avx(auVar103,auVar69);
      fVar2 = *(float *)(ray + k * 4 + 0x50);
      auVar104._4_4_ = fVar2;
      auVar104._0_4_ = fVar2;
      auVar104._8_4_ = fVar2;
      auVar104._12_4_ = fVar2;
      auVar104._16_4_ = fVar2;
      auVar104._20_4_ = fVar2;
      auVar104._24_4_ = fVar2;
      auVar104._28_4_ = fVar2;
      auVar26 = vsubps_avx(auVar111,auVar75);
      fVar86 = *(float *)(ray + k * 4 + 0x60);
      auVar109._4_4_ = fVar86;
      auVar109._0_4_ = fVar86;
      auVar109._8_4_ = fVar86;
      auVar109._12_4_ = fVar86;
      auVar109._16_4_ = fVar86;
      auVar109._20_4_ = fVar86;
      auVar109._24_4_ = fVar86;
      auVar109._28_4_ = fVar86;
      auVar56 = vsubps_avx(auVar114,auVar83);
      auVar27._4_4_ = fVar1 * auVar26._4_4_;
      auVar27._0_4_ = fVar1 * auVar26._0_4_;
      auVar27._8_4_ = fVar1 * auVar26._8_4_;
      auVar27._12_4_ = fVar1 * auVar26._12_4_;
      auVar27._16_4_ = fVar1 * auVar26._16_4_;
      auVar27._20_4_ = fVar1 * auVar26._20_4_;
      auVar27._24_4_ = fVar1 * auVar26._24_4_;
      auVar27._28_4_ = auVar77._12_4_;
      auVar64 = vfmsub231ps_fma(auVar27,auVar25,auVar104);
      auVar28._4_4_ = auVar24._4_4_ * auVar64._4_4_;
      auVar28._0_4_ = auVar24._0_4_ * auVar64._0_4_;
      auVar28._8_4_ = auVar24._8_4_ * auVar64._8_4_;
      auVar28._12_4_ = auVar24._12_4_ * auVar64._12_4_;
      auVar28._16_4_ = auVar24._16_4_ * 0.0;
      auVar28._20_4_ = auVar24._20_4_ * 0.0;
      auVar28._24_4_ = auVar24._24_4_ * 0.0;
      auVar28._28_4_ = auVar24._28_4_;
      auVar112._0_4_ = auVar22._0_4_ * auVar64._0_4_;
      auVar112._4_4_ = auVar22._4_4_ * auVar64._4_4_;
      auVar112._8_4_ = auVar22._8_4_ * auVar64._8_4_;
      auVar112._12_4_ = auVar22._12_4_ * auVar64._12_4_;
      auVar112._16_4_ = auVar22._16_4_ * 0.0;
      auVar112._20_4_ = auVar22._20_4_ * 0.0;
      auVar112._24_4_ = auVar22._24_4_ * 0.0;
      auVar112._28_4_ = 0;
      auVar24._4_4_ = fVar86 * auVar25._4_4_;
      auVar24._0_4_ = fVar86 * auVar25._0_4_;
      auVar24._8_4_ = fVar86 * auVar25._8_4_;
      auVar24._12_4_ = fVar86 * auVar25._12_4_;
      auVar24._16_4_ = fVar86 * auVar25._16_4_;
      auVar24._20_4_ = fVar86 * auVar25._20_4_;
      auVar24._24_4_ = fVar86 * auVar25._24_4_;
      auVar24._28_4_ = auVar22._28_4_;
      auVar63 = vfmsub231ps_fma(auVar24,auVar56,auVar98);
      auVar64 = vfmadd231ps_fma(auVar28,ZEXT1632(auVar63),auVar23);
      auVar63 = vfmadd231ps_fma(auVar112,auVar84,ZEXT1632(auVar63));
      auVar22._4_4_ = auVar58._4_4_ * auVar23._4_4_;
      auVar22._0_4_ = auVar58._0_4_ * auVar23._0_4_;
      auVar22._8_4_ = auVar58._8_4_ * auVar23._8_4_;
      auVar22._12_4_ = auVar58._12_4_ * auVar23._12_4_;
      auVar22._16_4_ = auVar58._16_4_ * auVar23._16_4_;
      auVar22._20_4_ = auVar58._20_4_ * auVar23._20_4_;
      auVar22._24_4_ = auVar58._24_4_ * auVar23._24_4_;
      auVar22._28_4_ = auVar23._28_4_;
      auVar77 = vfmsub231ps_fma(auVar22,auVar66,auVar84);
      auVar23._4_4_ = fVar2 * auVar56._4_4_;
      auVar23._0_4_ = fVar2 * auVar56._0_4_;
      auVar23._8_4_ = fVar2 * auVar56._8_4_;
      auVar23._12_4_ = fVar2 * auVar56._12_4_;
      auVar23._16_4_ = fVar2 * auVar56._16_4_;
      auVar23._20_4_ = fVar2 * auVar56._20_4_;
      auVar23._24_4_ = fVar2 * auVar56._24_4_;
      auVar23._28_4_ = auVar84._28_4_;
      auVar55 = vfmsub231ps_fma(auVar23,auVar26,auVar109);
      fVar1 = auVar77._0_4_;
      fVar2 = auVar77._4_4_;
      auVar29._4_4_ = fVar86 * fVar2;
      auVar29._0_4_ = fVar86 * fVar1;
      fVar17 = auVar77._8_4_;
      auVar29._8_4_ = fVar86 * fVar17;
      fVar18 = auVar77._12_4_;
      auVar29._12_4_ = fVar86 * fVar18;
      auVar29._16_4_ = fVar86 * 0.0;
      auVar29._20_4_ = fVar86 * 0.0;
      auVar29._24_4_ = fVar86 * 0.0;
      auVar29._28_4_ = fVar86;
      auVar70 = vfmadd231ps_fma(auVar29,ZEXT1632(auVar54),auVar104);
      auVar70 = vfmadd231ps_fma(ZEXT1632(auVar70),ZEXT1632(auVar62),auVar98);
      auVar94._8_4_ = 0x80000000;
      auVar94._0_8_ = 0x8000000080000000;
      auVar94._12_4_ = 0x80000000;
      auVar94._16_4_ = 0x80000000;
      auVar94._20_4_ = 0x80000000;
      auVar94._24_4_ = 0x80000000;
      auVar94._28_4_ = 0x80000000;
      auVar64 = vfmadd231ps_fma(ZEXT1632(auVar64),ZEXT1632(auVar55),auVar66);
      auVar84 = vandps_avx(ZEXT1632(auVar70),auVar94);
      uVar39 = auVar84._0_4_;
      auVar80._0_4_ = (float)(uVar39 ^ auVar64._0_4_);
      uVar35 = auVar84._4_4_;
      auVar80._4_4_ = (float)(uVar35 ^ auVar64._4_4_);
      uVar96 = auVar84._8_4_;
      auVar80._8_4_ = (float)(uVar96 ^ auVar64._8_4_);
      uVar97 = auVar84._12_4_;
      auVar80._12_4_ = (float)(uVar97 ^ auVar64._12_4_);
      local_11a0._16_4_ = auVar84._16_4_;
      auVar80._16_4_ = local_11a0._16_4_;
      local_11a0._20_4_ = auVar84._20_4_;
      auVar80._20_4_ = local_11a0._20_4_;
      local_11a0._24_4_ = auVar84._24_4_;
      auVar80._24_4_ = local_11a0._24_4_;
      local_11a0._28_4_ = auVar84._28_4_;
      auVar80._28_4_ = local_11a0._28_4_;
      auVar64 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar58,ZEXT1632(auVar55));
      local_11c0._0_4_ = (float)(uVar39 ^ auVar64._0_4_);
      local_11c0._4_4_ = (float)(uVar35 ^ auVar64._4_4_);
      local_11c0._8_4_ = (float)(uVar96 ^ auVar64._8_4_);
      local_11c0._12_4_ = (float)(uVar97 ^ auVar64._12_4_);
      local_11c0._16_4_ = local_11a0._16_4_;
      local_11c0._20_4_ = local_11a0._20_4_;
      local_11c0._24_4_ = local_11a0._24_4_;
      local_11c0._28_4_ = local_11a0._28_4_;
      auVar84 = vcmpps_avx(auVar80,ZEXT832(0) << 0x20,5);
      auVar58 = vcmpps_avx(local_11c0,ZEXT832(0) << 0x20,5);
      auVar84 = vandps_avx(auVar84,auVar58);
      auVar88._8_4_ = 0x7fffffff;
      auVar88._0_8_ = 0x7fffffff7fffffff;
      auVar88._12_4_ = 0x7fffffff;
      auVar88._16_4_ = 0x7fffffff;
      auVar88._20_4_ = 0x7fffffff;
      auVar88._24_4_ = 0x7fffffff;
      auVar88._28_4_ = 0x7fffffff;
      local_1180 = vandps_avx(ZEXT1632(auVar70),auVar88);
      auVar58 = vcmpps_avx(ZEXT1632(auVar70),ZEXT832(0) << 0x20,4);
      auVar84 = vandps_avx(auVar84,auVar58);
      auVar101._0_4_ = auVar80._0_4_ + local_11c0._0_4_;
      auVar101._4_4_ = auVar80._4_4_ + local_11c0._4_4_;
      auVar101._8_4_ = auVar80._8_4_ + local_11c0._8_4_;
      auVar101._12_4_ = auVar80._12_4_ + local_11c0._12_4_;
      auVar101._16_4_ = local_11a0._16_4_ + local_11a0._16_4_;
      auVar101._20_4_ = local_11a0._20_4_ + local_11a0._20_4_;
      auVar101._24_4_ = local_11a0._24_4_ + local_11a0._24_4_;
      auVar101._28_4_ = local_11a0._28_4_ + local_11a0._28_4_;
      auVar58 = vcmpps_avx(auVar101,local_1180,2);
      auVar22 = auVar58 & auVar84;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar84 = vandps_avx(auVar84,auVar58);
        auVar64 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar30._4_4_ = fVar2 * auVar56._4_4_;
        auVar30._0_4_ = fVar1 * auVar56._0_4_;
        auVar30._8_4_ = fVar17 * auVar56._8_4_;
        auVar30._12_4_ = fVar18 * auVar56._12_4_;
        auVar30._16_4_ = auVar56._16_4_ * 0.0;
        auVar30._20_4_ = auVar56._20_4_ * 0.0;
        auVar30._24_4_ = auVar56._24_4_ * 0.0;
        auVar30._28_4_ = auVar56._28_4_;
        auVar63 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar54),auVar30);
        auVar63 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar62),ZEXT1632(auVar63));
        local_11a0._0_4_ = (float)(uVar39 ^ auVar63._0_4_);
        local_11a0._4_4_ = (float)(uVar35 ^ auVar63._4_4_);
        local_11a0._8_4_ = (float)(uVar96 ^ auVar63._8_4_);
        local_11a0._12_4_ = (float)(uVar97 ^ auVar63._12_4_);
        fVar86 = *(float *)(ray + k * 4 + 0x30);
        auVar31._4_4_ = local_1180._4_4_ * fVar86;
        auVar31._0_4_ = local_1180._0_4_ * fVar86;
        auVar31._8_4_ = local_1180._8_4_ * fVar86;
        auVar31._12_4_ = local_1180._12_4_ * fVar86;
        auVar31._16_4_ = local_1180._16_4_ * fVar86;
        auVar31._20_4_ = local_1180._20_4_ * fVar86;
        auVar31._24_4_ = local_1180._24_4_ * fVar86;
        auVar31._28_4_ = fVar86;
        auVar84 = vcmpps_avx(auVar31,local_11a0,1);
        fVar86 = *(float *)(ray + k * 4 + 0x80);
        auVar61 = ZEXT3264(CONCAT428(fVar86,CONCAT424(fVar86,CONCAT420(fVar86,CONCAT416(fVar86,
                                                  CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,
                                                  fVar86))))))));
        auVar76._0_4_ = local_1180._0_4_ * fVar86;
        auVar76._4_4_ = local_1180._4_4_ * fVar86;
        auVar76._8_4_ = local_1180._8_4_ * fVar86;
        auVar76._12_4_ = local_1180._12_4_ * fVar86;
        auVar76._16_4_ = local_1180._16_4_ * fVar86;
        auVar76._20_4_ = local_1180._20_4_ * fVar86;
        auVar76._24_4_ = local_1180._24_4_ * fVar86;
        auVar76._28_4_ = 0;
        auVar58 = vcmpps_avx(local_11a0,auVar76,2);
        auVar84 = vandps_avx(auVar84,auVar58);
        auVar63 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
        auVar64 = vpand_avx(auVar64,auVar63);
        auVar84 = vpmovzxwd_avx2(auVar64);
        auVar84 = vpslld_avx2(auVar84,0x1f);
        if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar84 >> 0x7f,0) != '\0') ||
              (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar84 >> 0xbf,0) != '\0') ||
            (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar84[0x1f] < '\0') {
          local_13e0 = vpsrad_avx2(auVar84,0x1f);
          local_11e0 = auVar80;
          local_1160 = ZEXT1632(auVar62);
          local_1140 = ZEXT1632(auVar54);
          local_1120 = ZEXT1632(auVar77);
          local_1100 = local_13e0;
          local_1020 = local_fe0;
          auVar58 = vrcpps_avx(local_1180);
          auVar105._8_4_ = 0x3f800000;
          auVar105._0_8_ = 0x3f8000003f800000;
          auVar105._12_4_ = 0x3f800000;
          auVar105._16_4_ = 0x3f800000;
          auVar105._20_4_ = 0x3f800000;
          auVar105._24_4_ = 0x3f800000;
          auVar105._28_4_ = 0x3f800000;
          auVar63 = vfnmadd213ps_fma(local_1180,auVar58,auVar105);
          auVar63 = vfmadd132ps_fma(ZEXT1632(auVar63),auVar58,auVar58);
          fVar86 = auVar63._0_4_;
          fVar90 = auVar63._4_4_;
          local_10a0._4_4_ = fVar90 * local_11a0._4_4_;
          local_10a0._0_4_ = fVar86 * local_11a0._0_4_;
          fVar91 = auVar63._8_4_;
          local_10a0._8_4_ = fVar91 * local_11a0._8_4_;
          fVar92 = auVar63._12_4_;
          local_10a0._12_4_ = fVar92 * local_11a0._12_4_;
          local_10a0._16_4_ = local_11a0._16_4_ * 0.0;
          local_10a0._20_4_ = local_11a0._20_4_ * 0.0;
          local_10a0._24_4_ = local_11a0._24_4_ * 0.0;
          local_10a0._28_4_ = auVar58._28_4_;
          auVar85 = ZEXT3264(local_10a0);
          auVar32._4_4_ = fVar90 * auVar80._4_4_;
          auVar32._0_4_ = fVar86 * auVar80._0_4_;
          auVar32._8_4_ = fVar91 * auVar80._8_4_;
          auVar32._12_4_ = fVar92 * auVar80._12_4_;
          auVar32._16_4_ = local_11a0._16_4_ * 0.0;
          auVar32._20_4_ = local_11a0._20_4_ * 0.0;
          auVar32._24_4_ = local_11a0._24_4_ * 0.0;
          auVar32._28_4_ = local_11a0._28_4_;
          auVar58 = vminps_avx(auVar32,auVar105);
          auVar33._4_4_ = fVar90 * local_11c0._4_4_;
          auVar33._0_4_ = fVar86 * local_11c0._0_4_;
          auVar33._8_4_ = fVar91 * local_11c0._8_4_;
          auVar33._12_4_ = fVar92 * local_11c0._12_4_;
          auVar33._16_4_ = local_11a0._16_4_ * 0.0;
          auVar33._20_4_ = local_11a0._20_4_ * 0.0;
          auVar33._24_4_ = local_11a0._24_4_ * 0.0;
          auVar33._28_4_ = local_11a0._28_4_;
          auVar22 = vminps_avx(auVar33,auVar105);
          auVar66 = vsubps_avx(auVar105,auVar58);
          auVar23 = vsubps_avx(auVar105,auVar22);
          local_10c0 = vblendvps_avx(auVar22,auVar66,local_fe0);
          local_10e0 = vblendvps_avx(auVar58,auVar23,local_fe0);
          fVar86 = local_1000._0_4_;
          local_1080._0_4_ = auVar62._0_4_ * fVar86;
          fVar90 = local_1000._4_4_;
          local_1080._4_4_ = auVar62._4_4_ * fVar90;
          fVar91 = local_1000._8_4_;
          local_1080._8_4_ = auVar62._8_4_ * fVar91;
          fVar92 = local_1000._12_4_;
          local_1080._12_4_ = auVar62._12_4_ * fVar92;
          fVar19 = local_1000._16_4_;
          local_1080._16_4_ = fVar19 * 0.0;
          fVar20 = local_1000._20_4_;
          local_1080._20_4_ = fVar20 * 0.0;
          fVar21 = local_1000._24_4_;
          local_1080._24_4_ = fVar21 * 0.0;
          local_1080._28_4_ = 0;
          local_1060._0_4_ = fVar86 * auVar54._0_4_;
          local_1060._4_4_ = fVar90 * auVar54._4_4_;
          local_1060._8_4_ = fVar91 * auVar54._8_4_;
          local_1060._12_4_ = fVar92 * auVar54._12_4_;
          local_1060._16_4_ = fVar19 * 0.0;
          local_1060._20_4_ = fVar20 * 0.0;
          local_1060._24_4_ = fVar21 * 0.0;
          local_1060._28_4_ = 0;
          local_1040._0_4_ = fVar86 * fVar1;
          local_1040._4_4_ = fVar90 * fVar2;
          local_1040._8_4_ = fVar91 * fVar17;
          local_1040._12_4_ = fVar92 * fVar18;
          local_1040._16_4_ = fVar19 * 0.0;
          local_1040._20_4_ = fVar20 * 0.0;
          local_1040._24_4_ = fVar21 * 0.0;
          local_1040._28_4_ = 0;
          auVar57._8_4_ = 0x7f800000;
          auVar57._0_8_ = 0x7f8000007f800000;
          auVar57._12_4_ = 0x7f800000;
          auVar57._16_4_ = 0x7f800000;
          auVar57._20_4_ = 0x7f800000;
          auVar57._24_4_ = 0x7f800000;
          auVar57._28_4_ = 0x7f800000;
          auVar84 = vblendvps_avx(auVar57,local_10a0,auVar84);
          auVar58 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar58 = vminps_avx(auVar84,auVar58);
          auVar22 = vshufpd_avx(auVar58,auVar58,5);
          auVar58 = vminps_avx(auVar58,auVar22);
          auVar22 = vpermpd_avx2(auVar58,0x4e);
          auVar58 = vminps_avx(auVar58,auVar22);
          auVar84 = vcmpps_avx(auVar84,auVar58,0);
          auVar63 = vpackssdw_avx(auVar84._0_16_,auVar84._16_16_);
          auVar64 = vpand_avx(auVar63,auVar64);
          auVar84 = vpmovzxwd_avx2(auVar64);
          auVar58 = vpslld_avx2(auVar84,0x1f);
          auVar84 = local_13e0;
          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar58 >> 0x7f,0) != '\0') ||
                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar58 >> 0xbf,0) != '\0') ||
              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar58[0x1f] < '\0') {
            auVar84 = vpsrad_avx2(auVar58,0x1f);
          }
          auVar89 = ZEXT3264(auVar84);
LAB_01593a00:
          uVar35 = vmovmskps_avx(auVar89._0_32_);
          uVar39 = 0;
          for (; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x80000000) {
            uVar39 = uVar39 + 1;
          }
          uVar48 = (ulong)uVar39;
          local_1210 = *(uint *)((long)&local_fc0 + uVar48 * 4);
          pGVar11 = (pSVar9->geometries).items[local_1210].ptr;
          if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            *(undefined4 *)(local_13e0 + uVar48 * 4) = 0;
          }
          else {
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              uVar48 = (ulong)(uVar39 << 2);
              uVar107 = *(undefined4 *)(local_10e0 + uVar48);
              uVar3 = *(undefined4 *)(local_10c0 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10a0 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_1080 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_1060 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_1040 + uVar48);
              *(undefined4 *)(ray + k * 4 + 0xf0) = uVar107;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar3;
              *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_12a0 + uVar48);
              *(uint *)(ray + k * 4 + 0x120) = local_1210;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              goto LAB_015937e7;
            }
            local_13c0 = auVar85._0_32_;
            local_1400 = auVar61._0_32_;
            uVar49 = (ulong)(uVar39 * 4);
            uVar107 = *(undefined4 *)(local_10e0 + uVar49);
            local_1240._4_4_ = uVar107;
            local_1240._0_4_ = uVar107;
            local_1240._8_4_ = uVar107;
            local_1240._12_4_ = uVar107;
            local_1230 = *(undefined4 *)(local_10c0 + uVar49);
            uVar107 = *(undefined4 *)((long)&local_12a0 + uVar49);
            local_1220._4_4_ = uVar107;
            local_1220._0_4_ = uVar107;
            local_1220._8_4_ = uVar107;
            local_1220._12_4_ = uVar107;
            uVar107 = *(undefined4 *)(local_1080 + uVar49);
            uVar3 = *(undefined4 *)(local_1060 + uVar49);
            local_1260._4_4_ = uVar3;
            local_1260._0_4_ = uVar3;
            local_1260._8_4_ = uVar3;
            local_1260._12_4_ = uVar3;
            uVar3 = *(undefined4 *)(local_1040 + uVar49);
            local_1250._4_4_ = uVar3;
            local_1250._0_4_ = uVar3;
            local_1250._8_4_ = uVar3;
            local_1250._12_4_ = uVar3;
            local_1270[0] = (RTCHitN)(char)uVar107;
            local_1270[1] = (RTCHitN)(char)((uint)uVar107 >> 8);
            local_1270[2] = (RTCHitN)(char)((uint)uVar107 >> 0x10);
            local_1270[3] = (RTCHitN)(char)((uint)uVar107 >> 0x18);
            local_1270[4] = (RTCHitN)(char)uVar107;
            local_1270[5] = (RTCHitN)(char)((uint)uVar107 >> 8);
            local_1270[6] = (RTCHitN)(char)((uint)uVar107 >> 0x10);
            local_1270[7] = (RTCHitN)(char)((uint)uVar107 >> 0x18);
            local_1270[8] = (RTCHitN)(char)uVar107;
            local_1270[9] = (RTCHitN)(char)((uint)uVar107 >> 8);
            local_1270[10] = (RTCHitN)(char)((uint)uVar107 >> 0x10);
            local_1270[0xb] = (RTCHitN)(char)((uint)uVar107 >> 0x18);
            local_1270[0xc] = (RTCHitN)(char)uVar107;
            local_1270[0xd] = (RTCHitN)(char)((uint)uVar107 >> 8);
            local_1270[0xe] = (RTCHitN)(char)((uint)uVar107 >> 0x10);
            local_1270[0xf] = (RTCHitN)(char)((uint)uVar107 >> 0x18);
            uStack_122c = local_1230;
            uStack_1228 = local_1230;
            uStack_1224 = local_1230;
            uStack_120c = local_1210;
            uStack_1208 = local_1210;
            uStack_1204 = local_1210;
            vpcmpeqd_avx2(ZEXT1632(local_1240),ZEXT1632(local_1240));
            uStack_11fc = context->user->instID[0];
            local_1200 = uStack_11fc;
            uStack_11f8 = uStack_11fc;
            uStack_11f4 = uStack_11fc;
            uStack_11f0 = context->user->instPrimID[0];
            uStack_11ec = uStack_11f0;
            uStack_11e8 = uStack_11f0;
            uStack_11e4 = uStack_11f0;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_10a0 + uVar49);
            local_14b0 = *local_1498;
            local_1430.valid = (int *)local_14b0;
            local_1430.geometryUserPtr = pGVar11->userPtr;
            local_1430.context = context->user;
            local_1430.hit = local_1270;
            local_1430.N = 4;
            local_1430.ray = (RTCRayN *)ray;
            if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar11->intersectionFilterN)(&local_1430);
            }
            if (local_14b0 == (undefined1  [16])0x0) {
              auVar64 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
              auVar64 = auVar64 ^ _DAT_01f46b70;
            }
            else {
              p_Var15 = context->args->filter;
              if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar11->field_8).field_0x2 & 0x40) != 0))))
              {
                (*p_Var15)(&local_1430);
              }
              auVar63 = vpcmpeqd_avx(local_14b0,_DAT_01f45a50);
              auVar64 = auVar63 ^ _DAT_01f46b70;
              if (local_14b0 != (undefined1  [16])0x0) {
                auVar63 = auVar63 ^ _DAT_01f46b70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])local_1430.hit);
                *(undefined1 (*) [16])(local_1430.ray + 0xc0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x10));
                *(undefined1 (*) [16])(local_1430.ray + 0xd0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x20));
                *(undefined1 (*) [16])(local_1430.ray + 0xe0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x30));
                *(undefined1 (*) [16])(local_1430.ray + 0xf0) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x40));
                *(undefined1 (*) [16])(local_1430.ray + 0x100) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x50));
                *(undefined1 (*) [16])(local_1430.ray + 0x110) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x60));
                *(undefined1 (*) [16])(local_1430.ray + 0x120) = auVar70;
                auVar70 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x70));
                *(undefined1 (*) [16])(local_1430.ray + 0x130) = auVar70;
                auVar63 = vmaskmovps_avx(auVar63,*(undefined1 (*) [16])(local_1430.hit + 0x80));
                *(undefined1 (*) [16])(local_1430.ray + 0x140) = auVar63;
              }
            }
            auVar55._8_8_ = 0x100000001;
            auVar55._0_8_ = 0x100000001;
            if ((auVar55 & auVar64) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1400._0_4_;
            }
            else {
              local_1400 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
            }
            *(undefined4 *)(local_13e0 + uVar48 * 4) = 0;
            auVar61 = ZEXT3264(local_1400);
            uVar107 = local_1400._0_4_;
            auVar60._4_4_ = uVar107;
            auVar60._0_4_ = uVar107;
            auVar60._8_4_ = uVar107;
            auVar60._12_4_ = uVar107;
            auVar60._16_4_ = uVar107;
            auVar60._20_4_ = uVar107;
            auVar60._24_4_ = uVar107;
            auVar60._28_4_ = uVar107;
            auVar85 = ZEXT3264(local_13c0);
            auVar84 = vcmpps_avx(local_13c0,auVar60,2);
            local_13e0 = vandps_avx(auVar84,local_13e0);
          }
          auVar89 = ZEXT3264(local_13e0);
          if ((((((((local_13e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (local_13e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (local_13e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(local_13e0 >> 0x7f,0) == '\0') &&
                (local_13e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(local_13e0 >> 0xbf,0) == '\0') &&
              (local_13e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < local_13e0[0x1f]) goto LAB_015937e7;
          auVar59._8_4_ = 0x7f800000;
          auVar59._0_8_ = 0x7f8000007f800000;
          auVar59._12_4_ = 0x7f800000;
          auVar59._16_4_ = 0x7f800000;
          auVar59._20_4_ = 0x7f800000;
          auVar59._24_4_ = 0x7f800000;
          auVar59._28_4_ = 0x7f800000;
          auVar84 = vblendvps_avx(auVar59,auVar85._0_32_,local_13e0);
          auVar58 = vshufps_avx(auVar84,auVar84,0xb1);
          auVar58 = vminps_avx(auVar84,auVar58);
          auVar22 = vshufpd_avx(auVar58,auVar58,5);
          auVar58 = vminps_avx(auVar58,auVar22);
          auVar22 = vpermpd_avx2(auVar58,0x4e);
          auVar58 = vminps_avx(auVar58,auVar22);
          auVar84 = vcmpps_avx(auVar84,auVar58,0);
          auVar58 = local_13e0 & auVar84;
          if ((((((((auVar58 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar58 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar58 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar58 >> 0x7f,0) != '\0') ||
                (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar58 >> 0xbf,0) != '\0') ||
              (auVar58 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar58[0x1f] < '\0') {
            auVar84 = vandps_avx(auVar84,local_13e0);
            auVar89 = ZEXT3264(auVar84);
          }
          goto LAB_01593a00;
        }
      }
LAB_015937e7:
      auVar85 = ZEXT1664(local_1340);
      auVar89 = ZEXT1664(local_1350);
      auVar95 = ZEXT1664(local_1360);
      auVar99 = ZEXT1664(local_1370);
      auVar102 = ZEXT1664(local_1380);
      auVar106 = ZEXT1664(local_1390);
      auVar110 = ZEXT1664(local_13a0);
      uVar48 = local_1488;
      uVar49 = local_1490;
    }
    uVar107 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar61 = ZEXT1664(CONCAT412(uVar107,CONCAT48(uVar107,CONCAT44(uVar107,uVar107))));
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }